

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pigpiod_if.c
# Opt level: O1

int store_script(char *script)

{
  int iVar1;
  size_t sVar2;
  gpioExtent_t ext [1];
  
  sVar2 = strlen(script);
  if ((int)sVar2 == 0) {
    iVar1 = 0;
  }
  else {
    ext[0].size = sVar2 & 0xffffffff;
    ext[0].ptr = script;
    iVar1 = pigpio_command_ext(gPigCommand,0x26,0,0,(int)sVar2,1,ext,1);
  }
  return iVar1;
}

Assistant:

int store_script(char *script)
{
   unsigned len;
   gpioExtent_t ext[1];

   /*
   p1=0
   p2=0
   p3=len
   ## extension ##
   char[len] script
   */

   len = strlen(script);

   if (!len) return 0;

   ext[0].size = len;
   ext[0].ptr = script;

   return pigpio_command_ext(gPigCommand, PI_CMD_PROC, 0, 0, len, 1, ext, 1);
}